

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__instance_controller
          (NodeLoader *this,instance_controller__AttributeData *attributeData)

{
  Node *pNVar1;
  _Elt_pointer ppNVar2;
  UniqueId *pUVar3;
  GeometryMaterialIdInfo *pGVar4;
  list<COLLADASaxFWL::Loader::InstanceControllerData,std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>>
  *this_00;
  _Node *p_Var5;
  UniqueId instantiatedControllerUniqueId;
  InstanceController *instanceController;
  UniqueId uniqueId;
  InstanceControllerData instanceControllerData;
  UniqueId local_68;
  InstanceController *local_50;
  UniqueId local_48;
  InstanceControllerData local_30;
  
  ppNVar2 = (this->mNodeStack).c.
            super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppNVar2 ==
      (this->mNodeStack).c.super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppNVar2 = (this->mNodeStack).c.
              super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pNVar1 = ppNVar2[-1];
  pUVar3 = IFilePartLoader::createUniqueIdFromUrl
                     (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                       super_IFilePartLoader,&attributeData->url,SKIN_DATA,false);
  local_68.mClassId = pUVar3->mClassId;
  local_68._4_4_ = *(undefined4 *)&pUVar3->field_0x4;
  local_68.mObjectId = pUVar3->mObjectId;
  local_68.mFileId = pUVar3->mFileId;
  pGVar4 = IFilePartLoader::getMeshMaterialIdInfo
                     (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                       super_IFilePartLoader);
  this->mCurrentMaterialInfo = pGVar4;
  IFilePartLoader::createUniqueId
            (&local_48,
             &((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             INSTANCE_CONTROLLER);
  local_50 = (InstanceController *)operator_new(0x98);
  (local_50->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)431>.mUniqueId.mFileId = local_48.mFileId;
  (local_50->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)431>.mUniqueId.mClassId = local_48.mClassId
  ;
  *(undefined4 *)
   &(local_50->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>).
    super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)431>.mUniqueId.field_0x4 = local_48._4_4_
  ;
  (local_50->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)431>.mUniqueId.mObjectId =
       local_48.mObjectId;
  (local_50->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>).mName._M_dataplus._M_p =
       (pointer)&(local_50->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>).mName.field_2
  ;
  (local_50->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>).mName._M_string_length = 0;
  (local_50->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>).mName.field_2._M_local_buf
  [0] = '\0';
  (local_50->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>).mInstanciatedObjectId.
  mClassId = local_68.mClassId;
  *(undefined4 *)
   &(local_50->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>).mInstanciatedObjectId.
    field_0x4 = local_68._4_4_;
  (local_50->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>).mInstanciatedObjectId.
  mObjectId = local_68.mObjectId;
  (local_50->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>).mInstanciatedObjectId.
  mFileId = local_68.mFileId;
  (local_50->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)431>.super_Object._vptr_Object =
       (_func_int **)&PTR__InstanceBindingBase_009b04e0;
  (local_50->mMaterialBindings)._vptr_Array = (_func_int **)&PTR_releaseMemory_009b02f0;
  (local_50->mMaterialBindings).mData = (MaterialBinding *)0x0;
  (local_50->mMaterialBindings).mCount = 0;
  *(undefined8 *)((long)&(local_50->mMaterialBindings).mCount + 4) = 0;
  *(undefined8 *)((long)&(local_50->mMaterialBindings).mCapacity + 4) = 0;
  (local_50->mSkeletons).super__Vector_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (local_50->mSkeletons).super__Vector_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_50->mSkeletons).super__Vector_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mCurrentInstanceController = local_50;
  COLLADAFW::
  ArrayPrimitiveType<COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>_*>::
  append(&(pNVar1->mInstanceControllers).
          super_ArrayPrimitiveType<COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>_*>
         ,&local_50);
  local_30.skeletonRoots.super__List_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&local_30;
  local_30.skeletonRoots.super__List_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>._M_impl.
  _M_node._M_size = 0;
  local_30.instanceController = local_50;
  local_30.skeletonRoots.super__List_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       local_30.skeletonRoots.super__List_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  this_00 = (list<COLLADASaxFWL::Loader::InstanceControllerData,std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>>
             *)IFilePartLoader::getInstanceControllerDataListByControllerUniqueId_abi_cxx11_
                         (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                           super_IFilePartLoader,&local_68);
  p_Var5 = std::__cxx11::
           list<COLLADASaxFWL::Loader::InstanceControllerData,std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>>
           ::_M_create_node<COLLADASaxFWL::Loader::InstanceControllerData_const&>(this_00,&local_30)
  ;
  std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
  *(long *)(this_00 + 0x10) = *(long *)(this_00 + 0x10) + 1;
  this->mCurrentInstanceControllerData = (InstanceControllerData *)(*(long *)(this_00 + 8) + 0x10);
  std::__cxx11::_List_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>::_M_clear
            ((_List_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_> *)&local_30);
  COLLADAFW::UniqueId::~UniqueId(&local_48);
  COLLADAFW::UniqueId::~UniqueId(&local_68);
  return true;
}

Assistant:

bool NodeLoader::begin__instance_controller( const instance_controller__AttributeData& attributeData )
	{
		COLLADAFW::Node* currentNode = mNodeStack.top();
		COLLADAFW::UniqueId instantiatedControllerUniqueId = getHandlingFilePartLoader()->createUniqueIdFromUrl( attributeData.url, COLLADAFW::SkinControllerData::ID() );
		mCurrentMaterialInfo = &getHandlingFilePartLoader()->getMeshMaterialIdInfo();

        COLLADAFW::UniqueId uniqueId = getHandlingFilePartLoader()->createUniqueId ( COLLADAFW::InstanceController::ID() );
		COLLADAFW::InstanceController* instanceController = FW_NEW COLLADAFW::InstanceController( uniqueId, instantiatedControllerUniqueId);
		mCurrentInstanceController = instanceController;
		currentNode->getInstanceControllers().append(instanceController);

		Loader::InstanceControllerData instanceControllerData;
		instanceControllerData.instanceController = instanceController;
		Loader::InstanceControllerDataList& instanceControllerDataList = getHandlingFilePartLoader()->getInstanceControllerDataListByControllerUniqueId(instantiatedControllerUniqueId);
		instanceControllerDataList.push_back(instanceControllerData);
		mCurrentInstanceControllerData = &instanceControllerDataList.back();

		return true;
	}